

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O3

void __thiscall
testing::internal::ExpectationBase::DescribeCallCountTo(ExpectationBase *this,ostream *os)

{
  uint uVar1;
  element_type *peVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"         Expected: to be ",0x19);
  peVar2 = (this->cardinality_).impl_.
           super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar2->_vptr_CardinalityInterface[6])(peVar2,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
  Cardinality::DescribeActualCallCountTo(this->call_count_,os);
  std::__ostream_insert<char,std::char_traits<char>>(os," - ",3);
  uVar1 = this->call_count_;
  peVar2 = (this->cardinality_).impl_.
           super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar3 = (*peVar2->_vptr_CardinalityInterface[5])(peVar2,(ulong)uVar1);
  if (((char)iVar3 == '\0') ||
     (peVar2 = (this->cardinality_).impl_.
               super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr, iVar3 = (*peVar2->_vptr_CardinalityInterface[4])(peVar2,(ulong)uVar1),
     (char)iVar3 != '\0')) {
    peVar2 = (this->cardinality_).impl_.
             super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar3 = (*peVar2->_vptr_CardinalityInterface[5])(peVar2,(ulong)(uint)this->call_count_);
    if ((char)iVar3 == '\0') {
      peVar2 = (this->cardinality_).impl_.
               super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar3 = (*peVar2->_vptr_CardinalityInterface[4])(peVar2,(ulong)(uint)this->call_count_);
      pcVar5 = "unsatisfied";
      if ((char)iVar3 != '\0') {
        pcVar5 = "satisfied";
      }
    }
    else {
      pcVar5 = "saturated";
    }
  }
  else {
    pcVar5 = "over-saturated";
  }
  sVar4 = strlen(pcVar5);
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>(os," and ",5);
  pcVar5 = "active";
  if ((ulong)this->retired_ != 0) {
    pcVar5 = "retired";
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar5,(ulong)this->retired_ | 6);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();

  // Describes how many times the function is expected to be called.
  *os << "         Expected: to be ";
  cardinality().DescribeTo(os);
  *os << "\n           Actual: ";
  Cardinality::DescribeActualCallCountTo(call_count(), os);

  // Describes the state of the expectation (e.g. is it satisfied?
  // is it active?).
  *os << " - " << (IsOverSaturated() ? "over-saturated" :
                   IsSaturated() ? "saturated" :
                   IsSatisfied() ? "satisfied" : "unsatisfied")
      << " and "
      << (is_retired() ? "retired" : "active");
}